

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance_test.cc
# Opt level: O0

void __thiscall EditDistanceTestTestEmpty::Run(EditDistanceTestTestEmpty *this)

{
  Test *pTVar1;
  int iVar2;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  StringPiece local_30;
  StringPiece local_20;
  EditDistanceTestTestEmpty *local_10;
  EditDistanceTestTestEmpty *this_local;
  
  pTVar1 = g_current_test;
  local_10 = this;
  StringPiece::StringPiece(&local_20,"");
  StringPiece::StringPiece(&local_30,"ninja");
  iVar2 = EditDistance(&local_20,&local_30,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x14,"5 == EditDistance(\"\", \"ninja\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_40,"ninja");
  StringPiece::StringPiece(&local_50,"");
  iVar2 = EditDistance(&local_40,&local_50,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x15,"5 == EditDistance(\"ninja\", \"\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_60,"");
  StringPiece::StringPiece(&local_70,"");
  iVar2 = EditDistance(&local_60,&local_70,true,0);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/edit_distance_test.cc"
             ,0x16,"0 == EditDistance(\"\", \"\")");
  return;
}

Assistant:

TEST(EditDistanceTest, TestEmpty) {
  EXPECT_EQ(5, EditDistance("", "ninja"));
  EXPECT_EQ(5, EditDistance("ninja", ""));
  EXPECT_EQ(0, EditDistance("", ""));
}